

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::objectIndex
          (Interpreter *this,LocationRange *loc,HeapObject *obj,Identifier *f,uint offset)

{
  mapped_type pHVar1;
  HeapEntity *context;
  HeapEntity *context_00;
  const_iterator cVar2;
  iterator iVar3;
  mapped_type *ppHVar4;
  RuntimeError *__return_storage_ptr__;
  undefined4 in_register_00000084;
  AST *pAVar5;
  uint found_at;
  Identifier *f_local;
  BindingFrame binds;
  string local_50;
  
  found_at = 0;
  f_local = f;
  context = (HeapEntity *)
            findObject((Interpreter *)f,(Identifier *)obj,(HeapObject *)(ulong)offset,
                       (uint)&found_at,(uint *)CONCAT44(in_register_00000084,offset));
  if (context != (HeapEntity *)0x0) {
    context_00 = (HeapEntity *)
                 __dynamic_cast(context,&(anonymous_namespace)::HeapLeafObject::typeinfo,
                                &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
    if (context_00 == (HeapEntity *)0x0) {
      iVar3 = std::
              map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
              ::find((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                      *)(context + 5),&f_local);
      pHVar1 = (mapped_type)iVar3._M_node[1]._M_parent;
      std::
      map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
      ::map(&binds,(map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                    *)(context + 1));
      ppHVar4 = std::
                map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                ::operator[](&binds,(key_type *)&context[4].mark);
      *ppHVar4 = pHVar1;
      Stack::newCall(&this->stack,loc,context,obj,found_at,&binds);
      pAVar5 = (AST *)context[4]._vptr_HeapEntity;
      std::
      map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
      ::~map(&binds);
    }
    else {
      cVar2 = std::
              map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
              ::find((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapSimpleObject::Field>_>_>
                      *)(context_00 + 4),&f_local);
      pAVar5 = (AST *)cVar2._M_node[1]._M_left;
      Stack::newCall(&this->stack,loc,context_00,obj,found_at,(BindingFrame *)(context_00 + 1));
    }
    return pAVar5;
  }
  __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
  encode_utf8(&local_50,&f->name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&binds,
                 "field does not exist: ",&local_50);
  Stack::makeError(__return_storage_ptr__,&this->stack,loc,(string *)&binds);
  __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *objectIndex(const LocationRange &loc, HeapObject *obj, const Identifier *f,
                           unsigned offset)
    {
        unsigned found_at = 0;
        HeapObject *self = obj;
        HeapLeafObject *found = findObject(f, obj, offset, found_at);
        if (found == nullptr) {
            throw makeError(loc, "field does not exist: " + encode_utf8(f->name));
        }
        if (auto *simp = dynamic_cast<HeapSimpleObject *>(found)) {
            auto it = simp->fields.find(f);
            const AST *body = it->second.body;

            stack.newCall(loc, simp, self, found_at, simp->upValues);
            return body;
        } else {
            // If a HeapLeafObject is not HeapSimpleObject, it must be HeapComprehensionObject.
            auto *comp = static_cast<HeapComprehensionObject *>(found);
            auto it = comp->compValues.find(f);
            auto *th = it->second;
            BindingFrame binds = comp->upValues;
            binds[comp->id] = th;
            stack.newCall(loc, comp, self, found_at, binds);
            return comp->value;
        }
    }